

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

int tjDecodeYUV(tjhandle handle,uchar *srcBuf,int pad,int subsamp,uchar *dstBuf,int width,int pitch,
               int height,int pixelFormat,int flags)

{
  int iVar1;
  int iVar2;
  int iVar3;
  tjinstance *this;
  uint uVar4;
  long in_FS_OFFSET;
  int strides [3];
  uchar *srcPlanes [3];
  uint local_54;
  uint local_50;
  uint local_4c;
  uchar *local_48;
  uchar *local_40;
  uchar *local_38;
  
  if (handle == (tjhandle)0x0) {
    builtin_strncpy((char *)(in_FS_OFFSET + -0xc2)," Invalid",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xba)," handle",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjDecode",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -200),"YUV(): I",8);
    return -1;
  }
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  if ((-1 < pad && srcBuf != (uchar *)0x0) &&
     (((0 < width && (uint)subsamp < 6) && (pad & pad - 1U) == 0) && 0 < height)) {
    iVar1 = tjPlaneWidth(0,width,subsamp);
    iVar2 = tjPlaneHeight(0,height,subsamp);
    uVar4 = (pad + iVar1) - 1U & -pad;
    local_54 = uVar4;
    local_48 = srcBuf;
    if (subsamp == 3) {
      local_38 = (uchar *)0x0;
      local_40 = (uchar *)0x0;
      local_50 = 0;
    }
    else {
      iVar1 = tjPlaneWidth(1,width,subsamp);
      iVar3 = tjPlaneHeight(1,height,subsamp);
      local_50 = (pad - 1U) + iVar1 & -pad;
      local_40 = srcBuf + (int)(uVar4 * iVar2);
      local_38 = local_40 + (int)(iVar3 * local_50);
    }
    local_4c = local_50;
    iVar1 = tjDecodeYUVPlanes(handle,&local_48,(int *)&local_54,subsamp,dstBuf,width,pitch,height,
                              pixelFormat,flags);
    return iVar1;
  }
  builtin_strncpy((char *)((long)handle + 0x618),"nvalid a",8);
  builtin_strncpy((char *)((long)handle + 0x620),"rgument",8);
  builtin_strncpy((char *)((long)handle + 0x608),"tjDecode",8);
  builtin_strncpy((char *)((long)handle + 0x610),"YUV(): I",8);
  *(undefined4 *)((long)handle + 0x6d0) = 1;
  builtin_strncpy((char *)(in_FS_OFFSET + -0xc0),"nvalid a",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xb8),"rgument",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjDecode",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -200),"YUV(): I",8);
  return -1;
}

Assistant:

DLLEXPORT int tjDecodeYUV(tjhandle handle, const unsigned char *srcBuf,
                          int pad, int subsamp, unsigned char *dstBuf,
                          int width, int pitch, int height, int pixelFormat,
                          int flags)
{
  const unsigned char *srcPlanes[3];
  int pw0, ph0, strides[3], retval = -1;
  tjinstance *this = (tjinstance *)handle;

  if (!this) THROWG("tjDecodeYUV(): Invalid handle");
  this->isInstanceError = FALSE;

  if (srcBuf == NULL || pad < 0 || !IS_POW2(pad) || subsamp < 0 ||
      subsamp >= NUMSUBOPT || width <= 0 || height <= 0)
    THROW("tjDecodeYUV(): Invalid argument");

  pw0 = tjPlaneWidth(0, width, subsamp);
  ph0 = tjPlaneHeight(0, height, subsamp);
  srcPlanes[0] = srcBuf;
  strides[0] = PAD(pw0, pad);
  if (subsamp == TJSAMP_GRAY) {
    strides[1] = strides[2] = 0;
    srcPlanes[1] = srcPlanes[2] = NULL;
  } else {
    int pw1 = tjPlaneWidth(1, width, subsamp);
    int ph1 = tjPlaneHeight(1, height, subsamp);

    strides[1] = strides[2] = PAD(pw1, pad);
    srcPlanes[1] = srcPlanes[0] + strides[0] * ph0;
    srcPlanes[2] = srcPlanes[1] + strides[1] * ph1;
  }

  return tjDecodeYUVPlanes(handle, srcPlanes, strides, subsamp, dstBuf, width,
                           pitch, height, pixelFormat, flags);

bailout:
  return retval;
}